

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O1

void __thiscall
SLogLib::FileLoggerPriv::FileLoggerPriv
          (FileLoggerPriv *this,string *fileName,openmode mode,FileOpenFlag flag)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  runtime_error *this_00;
  stringstream _stream;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::ofstream::ofstream(this);
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mFileName,pcVar1,pcVar1 + fileName->_M_string_length);
  this->mHasAutoFlush = false;
  this->mMode = mode;
  this->mFileOpenFlag = flag;
  *(undefined8 *)((long)&(this->mFileWriteMutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mFileWriteMutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->mFileWriteMutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  if (flag == Immediately) {
    std::ofstream::open((char *)this,(_Ios_Openmode)(this->mFileName)._M_dataplus._M_p);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"SLogLib: Unable to open ",0x18);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->mFileName)._M_dataplus._M_p,
                          (this->mFileName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," for writing.",0xd);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1d8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

FileLoggerPriv(const std::string& fileName, std::ios_base::openmode mode, FileOpenFlag flag)
		: mFileName(fileName), mHasAutoFlush(false), mMode(mode), mFileOpenFlag(flag)
	{
		if(mFileOpenFlag == FileOpenFlag::Immediately)
		{
			mFileHandle.open(mFileName.c_str(), mMode);
			if(!mFileHandle.is_open())
			{
				std::stringstream _stream;
				_stream << "SLogLib: Unable to open " << mFileName << " for writing.";
				throw std::runtime_error(_stream.str());
			}
		}
	}